

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase223::run(TestCase223 *this)

{
  Orphanage OVar1;
  Builder BVar2;
  size_t local_1b0;
  Builder root;
  Fault f;
  Fault f_1;
  uint local_124;
  OrphanBuilder local_120;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  OVar1 = MessageBuilder::getOrphanage(&builder.super_MessageBuilder);
  OrphanBuilder::initData((OrphanBuilder *)&root,OVar1.arena,OVar1.capTable,2);
  local_120.segment = (SegmentBuilder *)root._builder.capTable;
  local_120.capTable = (CapTableBuilder *)root._builder.data;
  local_120.location = (word *)root._builder.pointers;
  BVar2 = OrphanBuilder::asData(&local_120);
  root._builder.capTable = (CapTableBuilder *)BVar2.super_ArrayPtr<unsigned_char>.size_;
  root._builder.segment._0_4_ = 2;
  root._builder.data = anon_var_dwarf_a914;
  root._builder.pointers = (WirePointer *)&DAT_00000005;
  root._builder.dataSize._0_1_ = root._builder.capTable == (CapTableBuilder *)0x2;
  if (!(bool)(undefined1)root._builder.dataSize) {
    local_1b0 = CONCAT44(local_1b0._4_4_,2);
    BVar2 = OrphanBuilder::asData(&local_120);
    f_1.exception = (Exception *)BVar2.super_ArrayPtr<unsigned_char>.size_;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_long>&,unsigned_int,unsigned_long>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0xe3,FAILED,"(2u) == (orphan.get().size())","_kjCondition,2u, orphan.get().size()",
               (DebugComparison<unsigned_int,_unsigned_long> *)&root,(uint *)&local_1b0,
               (unsigned_long *)&f_1);
    kj::_::Debug::Fault::fatal(&f);
  }
  BVar2 = OrphanBuilder::asData(&local_120);
  *BVar2.super_ArrayPtr<unsigned_char>.ptr = '{';
  BVar2 = OrphanBuilder::asData(&local_120);
  BVar2.super_ArrayPtr<unsigned_char>.ptr[1] = '-';
  MessageBuilder::getRootInternal((Builder *)&f_1,&builder.super_MessageBuilder);
  f = f_1;
  PointerBuilder::initStruct(&root._builder,(PointerBuilder *)&f,(StructSize)0x140006);
  f.exception = (Exception *)CONCAT44(root._builder.segment._4_4_,root._builder.segment._0_4_);
  PointerBuilder::adopt((PointerBuilder *)&f,&local_120);
  f_1.exception = (Exception *)CONCAT44(root._builder.segment._4_4_,root._builder.segment._0_4_);
  BVar2 = PointerBuilder::getBlob<capnp::Data>((PointerBuilder *)&f_1,(void *)0x0,0);
  f.exception._0_4_ = 2;
  if (BVar2.super_ArrayPtr<unsigned_char>.size_ == 2) {
    f_1.exception = (Exception *)CONCAT44(root._builder.segment._4_4_,root._builder.segment._0_4_);
    BVar2 = PointerBuilder::getBlob<capnp::Data>((PointerBuilder *)&f_1,(void *)0x0,0);
    f.exception._0_4_ = 0x7b;
    if ((*BVar2.super_ArrayPtr<unsigned_char>.ptr != '{') && (kj::_::Debug::minSeverity < 3)) {
      local_1b0 = CONCAT44(local_1b0._4_4_,0x7b);
      f_1.exception = (Exception *)CONCAT44(root._builder.segment._4_4_,root._builder.segment._0_4_)
      ;
      BVar2 = PointerBuilder::getBlob<capnp::Data>((PointerBuilder *)&f_1,(void *)0x0,0);
      kj::_::Debug::
      log<char_const(&)[52],kj::_::DebugComparison<unsigned_int,unsigned_char&>&,unsigned_int,unsigned_char&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0xea,ERROR,
                 "\"failed: expected \" \"(123u) == (root.getDataField()[0])\", _kjCondition, 123u, root.getDataField()[0]"
                 ,(char (*) [52])"failed: expected (123u) == (root.getDataField()[0])",
                 (DebugComparison<unsigned_int,_unsigned_char_&> *)&f,(uint *)&local_1b0,
                 BVar2.super_ArrayPtr<unsigned_char>.ptr);
    }
    f_1.exception = (Exception *)CONCAT44(root._builder.segment._4_4_,root._builder.segment._0_4_);
    BVar2 = PointerBuilder::getBlob<capnp::Data>((PointerBuilder *)&f_1,(void *)0x0,0);
    f.exception._0_4_ = 0x2d;
    if ((BVar2.super_ArrayPtr<unsigned_char>.ptr[1] != '-') && (kj::_::Debug::minSeverity < 3)) {
      local_1b0 = CONCAT44(local_1b0._4_4_,0x2d);
      f_1.exception = (Exception *)CONCAT44(root._builder.segment._4_4_,root._builder.segment._0_4_)
      ;
      BVar2 = PointerBuilder::getBlob<capnp::Data>((PointerBuilder *)&f_1,(void *)0x0,0);
      kj::_::Debug::
      log<char_const(&)[51],kj::_::DebugComparison<unsigned_int,unsigned_char&>&,unsigned_int,unsigned_char&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0xeb,ERROR,
                 "\"failed: expected \" \"(45u) == (root.getDataField()[1])\", _kjCondition, 45u, root.getDataField()[1]"
                 ,(char (*) [51])"failed: expected (45u) == (root.getDataField()[1])",
                 (DebugComparison<unsigned_int,_unsigned_char_&> *)&f,(uint *)&local_1b0,
                 BVar2.super_ArrayPtr<unsigned_char>.ptr + 1);
    }
    if (local_120.segment != (SegmentBuilder *)0x0) {
      OrphanBuilder::euthanize(&local_120);
    }
    MallocMessageBuilder::~MallocMessageBuilder(&builder);
    return;
  }
  local_124 = 2;
  f_1.exception = (Exception *)CONCAT44(root._builder.segment._4_4_,root._builder.segment._0_4_);
  BVar2 = PointerBuilder::getBlob<capnp::Data>((PointerBuilder *)&f_1,(void *)0x0,0);
  local_1b0 = BVar2.super_ArrayPtr<unsigned_char>.size_;
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_long>&,unsigned_int,unsigned_long>
            (&f_1,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
             ,0xe9,FAILED,"(2u) == (root.getDataField().size())",
             "_kjCondition,2u, root.getDataField().size()",
             (DebugComparison<unsigned_int,_unsigned_long> *)&f,&local_124,&local_1b0);
  kj::_::Debug::Fault::fatal(&f_1);
}

Assistant:

TEST(Orphans, OrphanageData) {
  MallocMessageBuilder builder;

  Orphan<Data> orphan = builder.getOrphanage().newOrphan<Data>(2);
  ASSERT_EQ(2u, orphan.get().size());
  orphan.get()[0] = 123;
  orphan.get()[1] = 45;

  auto root = builder.initRoot<TestAllTypes>();
  root.adoptDataField(kj::mv(orphan));
  ASSERT_EQ(2u, root.getDataField().size());
  EXPECT_EQ(123u, root.getDataField()[0]);
  EXPECT_EQ(45u, root.getDataField()[1]);
}